

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r,secp256k1_scalar *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = secp256k1_scalar_check_overflow(a);
  if (iVar5 == 0) {
    uVar1 = a->d[3];
    uVar2 = a->d[2];
    uVar3 = a->d[0];
    uVar4 = a->d[1];
    r->v[0] = uVar3 & 0x3fffffffffffffff;
    r->v[1] = (uVar4 & 0xfffffffffffffff) << 2 | uVar3 >> 0x3e;
    r->v[2] = (uVar2 & 0x3ffffffffffffff) << 4 | uVar4 >> 0x3c;
    r->v[3] = (uVar1 & 0xffffffffffffff) << 6 | uVar2 >> 0x3a;
    r->v[4] = uVar1 >> 0x38;
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_4x64_impl.h"
          ,0x405,"test condition failed: secp256k1_scalar_check_overflow(a) == 0");
  abort();
}

Assistant:

static void secp256k1_scalar_to_signed62(secp256k1_modinv64_signed62 *r, const secp256k1_scalar *a) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const uint64_t a0 = a->d[0], a1 = a->d[1], a2 = a->d[2], a3 = a->d[3];

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_scalar_check_overflow(a) == 0);
#endif

    r->v[0] =  a0                   & M62;
    r->v[1] = (a0 >> 62 | a1 <<  2) & M62;
    r->v[2] = (a1 >> 60 | a2 <<  4) & M62;
    r->v[3] = (a2 >> 58 | a3 <<  6) & M62;
    r->v[4] =  a3 >> 56;
}